

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::is_hex(char c,int *v)

{
  int iVar1;
  int *v_local;
  char c_local;
  
  if (('\x1f' < c) && (iVar1 = isdigit((int)c), iVar1 != 0)) {
    *v = c + -0x30;
    return true;
  }
  if ((c < 'A') || ('F' < c)) {
    if ((c < 'a') || ('f' < c)) {
      v_local._7_1_ = false;
    }
    else {
      *v = c + -0x57;
      v_local._7_1_ = true;
    }
  }
  else {
    *v = c + -0x37;
    v_local._7_1_ = true;
  }
  return v_local._7_1_;
}

Assistant:

inline bool is_hex(char c, int &v) {
			if (0x20 <= c && isdigit(c)) {
				v = c - '0';
				return true;
			} else if ('A' <= c && c <= 'F') {
				v = c - 'A' + 10;
				return true;
			} else if ('a' <= c && c <= 'f') {
				v = c - 'a' + 10;
				return true;
			}
			return false;
		}